

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

__m256i * comp_avg(__m256i *data_ref_0,__m256i *res_unsigned,__m256i *wt,int use_dist_wtd_comp_avg)

{
  uint uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  int in_ECX;
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  __m256i wt_res;
  __m256i res_hi;
  __m256i res_lo;
  __m256i wt_res_hi;
  __m256i wt_res_lo;
  __m256i data_hi;
  __m256i data_lo;
  __m256i res;
  
  if (in_ECX == 0) {
    auVar3 = vpaddw_avx2(*in_RDI,*in_RSI);
    uVar1 = 1;
    vpsraw_avx2(auVar3,ZEXT416(1));
  }
  else {
    auVar3 = vpunpcklwd_avx2(*in_RDI,*in_RSI);
    auVar2 = vpunpckhwd_avx2(*in_RDI,*in_RSI);
    auVar3 = vpmaddwd_avx2(auVar3,*in_RDX);
    auVar2 = vpmaddwd_avx2(auVar2,*in_RDX);
    auVar3 = vpsrad_avx2(auVar3,ZEXT416(4));
    uVar1 = 4;
    auVar2 = vpsrad_avx2(auVar2,ZEXT416(4));
    vpackssdw_avx2(auVar3,auVar2);
  }
  return (__m256i *)(ulong)uVar1;
}

Assistant:

static inline __m256i comp_avg(const __m256i *const data_ref_0,
                               const __m256i *const res_unsigned,
                               const __m256i *const wt,
                               const int use_dist_wtd_comp_avg) {
  __m256i res;
  if (use_dist_wtd_comp_avg) {
    const __m256i data_lo = _mm256_unpacklo_epi16(*data_ref_0, *res_unsigned);
    const __m256i data_hi = _mm256_unpackhi_epi16(*data_ref_0, *res_unsigned);

    const __m256i wt_res_lo = _mm256_madd_epi16(data_lo, *wt);
    const __m256i wt_res_hi = _mm256_madd_epi16(data_hi, *wt);

    const __m256i res_lo = _mm256_srai_epi32(wt_res_lo, DIST_PRECISION_BITS);
    const __m256i res_hi = _mm256_srai_epi32(wt_res_hi, DIST_PRECISION_BITS);

    res = _mm256_packs_epi32(res_lo, res_hi);
  } else {
    const __m256i wt_res = _mm256_add_epi16(*data_ref_0, *res_unsigned);
    res = _mm256_srai_epi16(wt_res, 1);
  }
  return res;
}